

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  ImGuiOldColumns *pIVar4;
  ulong uVar5;
  ImGuiOldColumns *in_RAX;
  ImGuiOldColumns *pIVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  ImDrawListSplitter IStack_38;
  
  iVar2 = (window->ColumnsStorage).Size;
  uVar10 = (ulong)iVar2;
  bVar11 = 0 < (long)uVar10;
  if ((0 < (long)uVar10) && (in_RAX = (window->ColumnsStorage).Data, in_RAX->ID != id)) {
    uVar5 = 1;
    do {
      uVar8 = uVar5;
      if (uVar10 == uVar8) {
        bVar11 = uVar8 < uVar10;
        goto LAB_002e87f7;
      }
      pIVar4 = in_RAX + 1;
      pIVar6 = in_RAX + 1;
      in_RAX = pIVar4;
      uVar5 = uVar8 + 1;
    } while (pIVar6->ID != id);
    bVar11 = uVar8 < uVar10;
  }
LAB_002e87f7:
  if (!bVar11) {
    IStack_38._Current = 0;
    IStack_38._Count = 0;
    IStack_38._Channels.Size = 0;
    IStack_38._Channels.Capacity = 0;
    IStack_38._Channels.Data = (ImDrawChannel *)0x0;
    iVar3 = (window->ColumnsStorage).Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      iVar9 = iVar2 + 1;
      if (iVar2 + 1 < iVar7) {
        iVar9 = iVar7;
      }
      if (iVar3 < iVar9) {
        pIVar6 = (ImGuiOldColumns *)MemAlloc((long)iVar9 * 0x88);
        pIVar4 = (window->ColumnsStorage).Data;
        if (pIVar4 != (ImGuiOldColumns *)0x0) {
          memcpy(pIVar6,pIVar4,(long)(window->ColumnsStorage).Size * 0x88);
          MemFree((window->ColumnsStorage).Data);
        }
        (window->ColumnsStorage).Data = pIVar6;
        (window->ColumnsStorage).Capacity = iVar9;
      }
    }
    pIVar4 = (window->ColumnsStorage).Data;
    iVar2 = (window->ColumnsStorage).Size;
    pIVar4[iVar2].Splitter._Channels.Data = IStack_38._Channels.Data;
    pfVar1 = &pIVar4[iVar2].HostBackupClipRect.Min.y;
    *(undefined8 *)pfVar1 = 0;
    *(undefined8 *)(pfVar1 + 2) = 0;
    *(undefined8 *)(pfVar1 + 4) = 0;
    *(undefined8 *)(pfVar1 + 6) = 0;
    *(undefined8 *)(pfVar1 + 8) = 0;
    *(undefined8 *)(pfVar1 + 10) = 0;
    *(undefined8 *)(pfVar1 + 0xc) = IStack_38._0_8_;
    *(undefined8 *)(pfVar1 + 0xe) = IStack_38._Channels._0_8_;
    pIVar4 = pIVar4 + iVar2;
    pIVar4->ID = 0;
    pIVar4->Flags = 0;
    pIVar4->IsFirstFrame = false;
    pIVar4->IsBeingResized = false;
    *(undefined2 *)&pIVar4->field_0xa = 0;
    pIVar4->Current = 0;
    pIVar4->Count = 0;
    pIVar4->OffMinX = 0.0;
    pIVar4->OffMaxX = 0.0;
    pIVar4->LineMinY = 0.0;
    pIVar4->LineMaxY = 0.0;
    pIVar4->HostCursorPosY = 0.0;
    pIVar4->HostCursorMaxPosX = 0.0;
    (pIVar4->HostInitialClipRect).Min.x = 0.0;
    *(undefined8 *)&(pIVar4->HostInitialClipRect).Min.y = 0;
    *(undefined8 *)&(pIVar4->HostInitialClipRect).Max.y = 0;
    (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
    ImDrawListSplitter::ClearFreeMemory(&IStack_38);
    if (IStack_38._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(IStack_38._Channels.Data);
    }
    in_RAX = (window->ColumnsStorage).Data + (long)(window->ColumnsStorage).Size + -1;
    in_RAX->ID = id;
  }
  return in_RAX;
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}